

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::PaddingLayerParams::MergePartialFromCodedStream
          (PaddingLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  int iVar6;
  PaddingLayerParams_PaddingReplication *this_00;
  PaddingLayerParams_PaddingReflection *this_01;
  BorderAmounts *this_02;
  PaddingLayerParams_PaddingConstant *this_03;
  pair<int,_int> pVar7;
  char cVar8;
  Limit limit;
  ulong uVar9;
  CodedInputStream *pCVar10;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00489c7d;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00489c7d:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    uVar5 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) goto switchD_00489cd7_caseD_4;
    cVar8 = (char)uVar9;
    switch((uint)(uVar9 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar8 != '\n') break;
      if (this->_oneof_case_[0] == 1) {
        this_03 = (this->PaddingType_).constant_;
      }
      else {
        clear_PaddingType(this);
        this->_oneof_case_[0] = 1;
        this_03 = (PaddingLayerParams_PaddingConstant *)operator_new(0x18);
        PaddingLayerParams_PaddingConstant::PaddingLayerParams_PaddingConstant(this_03);
        (this->PaddingType_).constant_ = this_03;
      }
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (iVar6 = (int)(char)*puVar3, -1 < iVar6)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar6 < 0) {
          return false;
        }
      }
      pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar6);
      if ((long)pVar7 < 0) {
        return false;
      }
      bVar4 = PaddingLayerParams_PaddingConstant::MergePartialFromCodedStream(this_03,input);
LAB_00489eb6:
      if (bVar4 == false) {
        return false;
      }
      limit = pVar7.first;
LAB_00489ef2:
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,limit);
      goto LAB_00489ef7;
    case 2:
      if (cVar8 == '\x12') {
        if (this->_oneof_case_[0] != 2) {
          clear_PaddingType(this);
          this->_oneof_case_[0] = 2;
          this_01 = (PaddingLayerParams_PaddingReflection *)operator_new(0x18);
          PaddingLayerParams_PaddingReflection::PaddingLayerParams_PaddingReflection(this_01);
          (this->PaddingType_).reflection_ = this_01;
        }
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar6 = (int)(char)*puVar3, -1 < iVar6)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pCVar10 = input;
        pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar7 < 0) {
          return false;
        }
        bVar4 = PaddingLayerParams_PaddingReflection::MergePartialFromCodedStream
                          ((PaddingLayerParams_PaddingReflection *)pCVar10,input);
LAB_00489ee8:
        if (bVar4 == false) {
          return false;
        }
        limit = pVar7.first;
        goto LAB_00489ef2;
      }
      break;
    case 3:
      if (cVar8 == '\x1a') {
        if (this->_oneof_case_[0] != 3) {
          clear_PaddingType(this);
          this->_oneof_case_[0] = 3;
          this_00 = (PaddingLayerParams_PaddingReplication *)operator_new(0x18);
          PaddingLayerParams_PaddingReplication::PaddingLayerParams_PaddingReplication(this_00);
          (this->PaddingType_).replication_ = this_00;
        }
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar6 = (int)(char)*puVar3, -1 < iVar6)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pCVar10 = input;
        pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar7 < 0) {
          return false;
        }
        bVar4 = PaddingLayerParams_PaddingReplication::MergePartialFromCodedStream
                          ((PaddingLayerParams_PaddingReplication *)pCVar10,input);
        goto LAB_00489ee8;
      }
      break;
    case 10:
      if (cVar8 == 'R') {
        this_02 = this->paddingamounts_;
        if (this_02 == (BorderAmounts *)0x0) {
          this_02 = (BorderAmounts *)operator_new(0x30);
          BorderAmounts::BorderAmounts(this_02);
          this->paddingamounts_ = this_02;
        }
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar6 = (int)(char)*puVar3, -1 < iVar6)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar7 < 0) {
          return false;
        }
        bVar4 = BorderAmounts::MergePartialFromCodedStream(this_02,input);
        goto LAB_00489eb6;
      }
    }
switchD_00489cd7_caseD_4:
    if (uVar5 == 0) {
      return true;
    }
    if ((uVar5 & 7) == 4) {
      return true;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
LAB_00489ef7:
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool PaddingLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.PaddingLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.PaddingLayerParams.PaddingConstant constant = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_constant()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PaddingLayerParams.PaddingReflection reflection = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_reflection()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PaddingLayerParams.PaddingReplication replication = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_replication()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BorderAmounts paddingAmounts = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_paddingamounts()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.PaddingLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.PaddingLayerParams)
  return false;
#undef DO_
}